

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_constructor_test.h
# Opt level: O3

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
AssignmentFromInitializerListOverwritesExisting<phmap::parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_std::mutex>_>
::TestBody(AssignmentFromInitializerListOverwritesExisting<phmap::parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_std::mutex>_>
           *this)

{
  size_t sVar1;
  pointer ppVar2;
  long lVar3;
  parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_std::mutex>
  *m_00;
  char *message;
  Generator<std::pair<const_int,_int>,_void> gen;
  TypeParam m;
  Generator<std::pair<const_int,_int>,_void> local_e89;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_e88;
  key_equal local_e70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e68;
  int local_e60;
  void *local_e58;
  undefined8 uStack_e50;
  __pthread_internal_list *local_e48;
  pair<const_int,_int> local_e40;
  pair<const_int,_int> local_e38;
  pair<const_int,_int> local_e30;
  pair<const_int,_int> local_e28;
  pair<const_int,_int> local_e20;
  pair<const_int,_int> local_e18;
  __native_type local_e10 [42];
  size_t asStack_778 [13];
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  local_710;
  
  local_e40 = hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(&local_e89);
  local_e38 = hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(&local_e89);
  local_e30 = hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(&local_e89);
  local_e28 = hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(&local_e89);
  local_e20 = hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(&local_e89);
  lVar3 = 0x68;
  do {
    ppVar2 = hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
             next_id<phmap::priv::StatefulTestingHash>()::gId;
    sVar1 = hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
            next_id<phmap::priv::StatefulTestingEqual>()::gId.id_;
    *(undefined8 *)((long)asStack_778 + lVar3 + 0x30) = 0;
    *(undefined8 *)((long)asStack_778 + lVar3 + 0x38) = 0;
    *(undefined8 *)((long)asStack_778 + lVar3 + 0x20) = 0;
    *(undefined8 *)((long)asStack_778 + lVar3 + 0x28) = 0;
    *(undefined8 *)((long)asStack_778 + lVar3 + 0x10) = 0;
    *(undefined8 *)((long)asStack_778 + lVar3 + 0x18) = 0;
    *(undefined8 *)((long)asStack_778 + lVar3) = 0;
    *(undefined8 *)((long)asStack_778 + lVar3 + 8) = 0;
    *(undefined8 *)((long)asStack_778 + lVar3 + 0x40) = 0;
    *(undefined8 *)((long)asStack_778 + lVar3 + 0x50) = 0;
    *(size_t *)((long)asStack_778 + lVar3 + 0x58) = sVar1;
    local_e70.super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
         (WithId<phmap::priv::StatefulTestingEqual>)(sVar1 + 1);
    *(pointer *)((long)asStack_778 + lVar3 + 0x60) = ppVar2;
    local_e88.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)((long)&ppVar2->first + 1);
    *(undefined8 *)
     ((long)&local_710.sets_._M_elems[0].super_Lockable.super_mutex.super___mutex_base._M_mutex +
     lVar3) = 0;
    lVar3 = lVar3 + 0x70;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ =
         (size_t)local_e70.super_WithId<phmap::priv::StatefulTestingEqual>.id_;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         local_e88.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
  } while (lVar3 != 0x768);
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId = (pointer)((long)&ppVar2->first + 2);
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ = sVar1 + 2;
  local_e18.first = 0;
  local_e18.second = 0;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
  ::parallel_hash_set<std::pair<int_const,int>const*>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
              *)&local_e10[0].__data,&local_e40,&local_e18,0,(hasher *)&local_e88,&local_e70,
             (allocator_type *)&local_e18);
  lVar3 = 0x28;
  do {
    raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
    ::move_assign((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                   *)((long)&local_710.sets_._M_elems[0].super_Lockable.super_mutex.
                             super___mutex_base._M_mutex + lVar3),(long)local_e10 + lVar3);
    lVar3 = lVar3 + 0x70;
  } while (lVar3 != 0x728);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::~parallel_hash_set
            ((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
              *)&local_e10[0].__data);
  local_e60 = 3;
  std::vector<std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>>::
  vector<std::pair<int_const,int>const*,void>
            ((vector<std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>> *)&local_e58
             ,&local_e40,&local_e18,(allocator_type *)&local_e88);
  local_e10[0]._24_8_ = local_e48;
  local_e10[0]._16_8_ = uStack_e50;
  local_e10[0]._8_8_ = local_e58;
  local_e58 = (void *)0x0;
  uStack_e50 = 0;
  local_e48 = (__pthread_internal_list *)0x0;
  local_e10[0].__data.__lock = local_e60;
  items<phmap::parallel_flat_hash_map<int,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>,4ul,std::mutex>>
            (&local_e88,(priv *)&local_710,m_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<int_const,int>>>
  ::operator()(&local_e70,local_e10[0].__size,
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)"items(m)");
  if (local_e88.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e88.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e88.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e88.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((void *)local_e10[0]._8_8_ != (void *)0x0) {
    operator_delete((void *)local_e10[0]._8_8_,
                    local_e10[0].__data.__list.__prev - local_e10[0]._8_8_);
  }
  if (local_e58 != (void *)0x0) {
    operator_delete(local_e58,(long)local_e48 - (long)local_e58);
  }
  if ((char)local_e70.super_WithId<phmap::priv::StatefulTestingEqual>.id_ == '\0') {
    testing::Message::Message((Message *)&local_e10[0].__data);
    if (local_e68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_e68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x1d2,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_e88,(Message *)&local_e10[0].__data);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e88);
    if ((long *)CONCAT44(local_e10[0].__data.__count,local_e10[0].__data.__lock) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_e10[0].__data.__count,local_e10[0].__data.__lock) + 8))()
      ;
    }
  }
  if (local_e68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e68,local_e68);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::~parallel_hash_set(&local_710);
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, AssignmentFromInitializerListOverwritesExisting) {
  using T = hash_internal::GeneratedType<TypeParam>;
  hash_internal::Generator<T> gen;
  std::initializer_list<T> values = {gen(), gen(), gen(), gen(), gen()};
  TypeParam m;
  m = values;
  EXPECT_THAT(items(m), ::testing::UnorderedElementsAreArray(values));
}